

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadPayload(CrateReader *this,Payload *d)

{
  bool bVar1;
  ostream *poVar2;
  value_type *rhs;
  AssetPath local_3e8;
  undefined1 local_3a8 [8];
  LayerOffset layerOffset;
  ostringstream local_378 [8];
  ostringstream ss_e;
  optional<tinyusdz::Path> local_1f8;
  undefined1 local_120 [8];
  optional<tinyusdz::Path> path;
  PathIndex index;
  string assetPath;
  Payload *d_local;
  CrateReader *this_local;
  
  if (d == (Payload *)0x0) {
    return false;
  }
  ::std::__cxx11::string::string((string *)&index);
  bVar1 = ReadString(this,(string *)&index);
  if (!bVar1) {
    this_local._7_1_ = false;
    path.contained._204_4_ = 1;
    goto LAB_0023ad06;
  }
  PathIndex::PathIndex((PathIndex *)((long)&path.contained + 200));
  bVar1 = ReadIndex(this,(Index *)((long)&path.contained + 200));
  if (!bVar1) {
    this_local._7_1_ = false;
    path.contained._204_4_ = 1;
    goto LAB_0023ad06;
  }
  GetPath(&local_1f8,this,(Index)path.contained._200_4_);
  nonstd::optional_lite::optional<tinyusdz::Path>::optional<tinyusdz::Path,_0>
            ((optional<tinyusdz::Path> *)local_120,&local_1f8);
  nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_1f8);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_120);
  if (bVar1) {
    bVar1 = VersionGreaterThanOrEqualTo_0_8_0(this);
    if (bVar1) {
      LayerOffset::LayerOffset((LayerOffset *)local_3a8);
      bVar1 = ReadLayerOffset(this,(LayerOffset *)local_3a8);
      if (!bVar1) {
        this_local._7_1_ = false;
        path.contained._204_4_ = 1;
        goto LAB_0023acfa;
      }
      (d->layerOffset)._offset = (double)local_3a8;
      (d->layerOffset)._scale = layerOffset._offset;
    }
    tinyusdz::value::AssetPath::AssetPath(&local_3e8,(string *)&index);
    tinyusdz::value::AssetPath::operator=(&d->asset_path,&local_3e8);
    tinyusdz::value::AssetPath::~AssetPath(&local_3e8);
    rhs = nonstd::optional_lite::optional<tinyusdz::Path>::value
                    ((optional<tinyusdz::Path> *)local_120);
    Path::operator=(&d->prim_path,rhs);
    this_local._7_1_ = true;
    path.contained._204_4_ = 1;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_378);
    poVar2 = ::std::operator<<((ostream *)local_378,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadPayload");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x420);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_378,"Invalid Path index in Payload ValueRep.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&layerOffset._scale);
    ::std::__cxx11::string::~string((string *)&layerOffset._scale);
    this_local._7_1_ = false;
    path.contained._204_4_ = 1;
    ::std::__cxx11::ostringstream::~ostringstream(local_378);
  }
LAB_0023acfa:
  nonstd::optional_lite::optional<tinyusdz::Path>::~optional((optional<tinyusdz::Path> *)local_120);
LAB_0023ad06:
  ::std::__cxx11::string::~string((string *)&index);
  return this_local._7_1_;
}

Assistant:

bool CrateReader::ReadPayload(Payload *d) {

  if (!d) {
    return false;
  }

  // assetPath : string
  // primPath : Path

  std::string assetPath;
  if (!ReadString(&assetPath)) {
    return false;
  }


  crate::PathIndex index;
  if (!ReadIndex(&index)) {
    return false;
  }

  auto path = GetPath(index);
  if (!path) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Path index in Payload ValueRep.");
  }

  // LayerOffset from 0.8.0
  if (VersionGreaterThanOrEqualTo_0_8_0()) {
    LayerOffset layerOffset;
    if (!ReadLayerOffset(&layerOffset)) {
      return false;
    }
    d->layerOffset = layerOffset;
  }

  d->asset_path = assetPath;
  d->prim_path = path.value();

  return true;
}